

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

void XXH3_reset_internal(XXH3_state_t *statePtr,XXH64_hash_t seed,void *secret,size_t secretSize)

{
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  size_t initLength;
  size_t initStart;
  
  memset(in_RDI + 0x40,0,0x18);
  *in_RDI = 0xc2b2ae3d;
  in_RDI[1] = 0x9e3779b185ebca87;
  in_RDI[2] = 0xc2b2ae3d27d4eb4f;
  in_RDI[3] = 0x165667b19e3779f9;
  in_RDI[4] = 0x85ebca77c2b2ae63;
  in_RDI[5] = 0x85ebca77;
  in_RDI[6] = 0x27d4eb2f165667c5;
  in_RDI[7] = 0x9e3779b1;
  in_RDI[0x45] = in_RSI;
  in_RDI[0x47] = in_RDX;
  in_RDI[0x44] = in_RCX + -0x40;
  in_RDI[0x43] = (ulong)in_RDI[0x44] >> 3;
  return;
}

Assistant:

static void XXH3_reset_internal(XXH3_state_t* statePtr, XXH64_hash_t seed,
                                const void* secret, size_t secretSize) {
  size_t const initStart = offsetof(XXH3_state_t, bufferedSize);
  size_t const initLength =
      offsetof(XXH3_state_t, nbStripesPerBlock) - initStart;
  XXH_ASSERT(offsetof(XXH3_state_t, nbStripesPerBlock) > initStart);
  XXH_ASSERT(statePtr != NULL);
  /* set members from bufferedSize to nbStripesPerBlock (excluded) to 0 */
  memset((char*)statePtr + initStart, 0, initLength);
  statePtr->acc[0] = XXH_PRIME32_3;
  statePtr->acc[1] = XXH_PRIME64_1;
  statePtr->acc[2] = XXH_PRIME64_2;
  statePtr->acc[3] = XXH_PRIME64_3;
  statePtr->acc[4] = XXH_PRIME64_4;
  statePtr->acc[5] = XXH_PRIME32_2;
  statePtr->acc[6] = XXH_PRIME64_5;
  statePtr->acc[7] = XXH_PRIME32_1;
  statePtr->seed = seed;
  statePtr->extSecret = (const unsigned char*)secret;
  XXH_ASSERT(secretSize >= XXH3_SECRET_SIZE_MIN);
  statePtr->secretLimit = secretSize - XXH_STRIPE_LEN;
  statePtr->nbStripesPerBlock = statePtr->secretLimit / XXH_SECRET_CONSUME_RATE;
}